

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O3

UConverter *
ucnv_createConverterFromSharedData_63
          (UConverter *myUConverter,UConverterSharedData *mySharedConverterData,
          UConverterLoadArgs *pArgs,UErrorCode *err)

{
  char cVar1;
  UConverterStaticData *pUVar2;
  UConverterOpen p_Var3;
  UBool UVar4;
  
  if (U_ZERO_ERROR < *err) {
    ucnv_unloadSharedDataIfReady_63(mySharedConverterData);
    return myUConverter;
  }
  UVar4 = '\x01';
  if (myUConverter == (UConverter *)0x0) {
    myUConverter = (UConverter *)uprv_malloc_63(0x120);
    if (myUConverter == (UConverter *)0x0) {
      *err = U_MEMORY_ALLOCATION_ERROR;
      ucnv_unloadSharedDataIfReady_63(mySharedConverterData);
      return (UConverter *)0x0;
    }
    UVar4 = '\0';
  }
  memset(myUConverter,0,0x120);
  myUConverter->isCopyLocal = UVar4;
  myUConverter->sharedData = mySharedConverterData;
  myUConverter->options = pArgs->options;
  if (pArgs->onlyTestIsLoadable == '\0') {
    myUConverter->preFromUFirstCP = -1;
    myUConverter->fromCharErrorBehaviour = UCNV_TO_U_CALLBACK_SUBSTITUTE_63;
    myUConverter->fromUCharErrorBehaviour = UCNV_FROM_U_CALLBACK_SUBSTITUTE_63;
    myUConverter->toUnicodeStatus = mySharedConverterData->toUnicodeStatus;
    pUVar2 = mySharedConverterData->staticData;
    myUConverter->maxBytesPerUChar = pUVar2->maxBytesPerChar;
    myUConverter->subChar1 = pUVar2->subChar1;
    cVar1 = pUVar2->subCharLen;
    myUConverter->subCharLen = cVar1;
    myUConverter->subChars = (uint8_t *)myUConverter->subUChars;
    memcpy(myUConverter->subUChars,pUVar2->subChar,(long)cVar1);
    myUConverter->toUCallbackReason = UCNV_ILLEGAL;
  }
  p_Var3 = mySharedConverterData->impl->open;
  if (p_Var3 == (UConverterOpen)0x0) {
    return myUConverter;
  }
  (*p_Var3)(myUConverter,pArgs,err);
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    return myUConverter;
  }
  if (pArgs->onlyTestIsLoadable == '\0') {
    ucnv_close_63(myUConverter);
    return (UConverter *)0x0;
  }
  return myUConverter;
}

Assistant:

U_CFUNC UConverter*
ucnv_createConverterFromSharedData(UConverter *myUConverter,
                                   UConverterSharedData *mySharedConverterData,
                                   UConverterLoadArgs *pArgs,
                                   UErrorCode *err)
{
    UBool isCopyLocal;

    if(U_FAILURE(*err)) {
        ucnv_unloadSharedDataIfReady(mySharedConverterData);
        return myUConverter;
    }
    if(myUConverter == NULL)
    {
        myUConverter = (UConverter *) uprv_malloc (sizeof (UConverter));
        if(myUConverter == NULL)
        {
            *err = U_MEMORY_ALLOCATION_ERROR;
            ucnv_unloadSharedDataIfReady(mySharedConverterData);
            return NULL;
        }
        isCopyLocal = FALSE;
    } else {
        isCopyLocal = TRUE;
    }

    /* initialize the converter */
    uprv_memset(myUConverter, 0, sizeof(UConverter));
    myUConverter->isCopyLocal = isCopyLocal;
    /*myUConverter->isExtraLocal = FALSE;*/ /* Set by the memset call */
    myUConverter->sharedData = mySharedConverterData;
    myUConverter->options = pArgs->options;
    if(!pArgs->onlyTestIsLoadable) {
        myUConverter->preFromUFirstCP = U_SENTINEL;
        myUConverter->fromCharErrorBehaviour = UCNV_TO_U_DEFAULT_CALLBACK;
        myUConverter->fromUCharErrorBehaviour = UCNV_FROM_U_DEFAULT_CALLBACK;
        myUConverter->toUnicodeStatus = mySharedConverterData->toUnicodeStatus;
        myUConverter->maxBytesPerUChar = mySharedConverterData->staticData->maxBytesPerChar;
        myUConverter->subChar1 = mySharedConverterData->staticData->subChar1;
        myUConverter->subCharLen = mySharedConverterData->staticData->subCharLen;
        myUConverter->subChars = (uint8_t *)myUConverter->subUChars;
        uprv_memcpy(myUConverter->subChars, mySharedConverterData->staticData->subChar, myUConverter->subCharLen);
        myUConverter->toUCallbackReason = UCNV_ILLEGAL; /* default reason to invoke (*fromCharErrorBehaviour) */
    }

    if(mySharedConverterData->impl->open != NULL) {
        mySharedConverterData->impl->open(myUConverter, pArgs, err);
        if(U_FAILURE(*err) && !pArgs->onlyTestIsLoadable) {
            /* don't ucnv_close() if onlyTestIsLoadable because not fully initialized */
            ucnv_close(myUConverter);
            return NULL;
        }
    }

    return myUConverter;
}